

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O0

Ptr<Buffer>
myvk::Buffer::
CreateStaging<unsigned_int,OctreeBuilder::create_buffers(std::shared_ptr<myvk::Device>const&)::__1>
          (Ptr<Device> *device,VkDeviceSize count,anon_class_1_0_00000001 *writer_func,
          bool sequential_write,
          vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
          *access_queues)

{
  element_type *peVar1;
  anon_class_1_0_00000001 *in_RCX;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VkDeviceSize in_RSI;
  element_type *in_RDI;
  Ptr<Buffer> PVar2;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_00000010;
  Ptr<Buffer> *ret;
  
  Create((Ptr<Device> *)in_RDI,in_RSI,(VmaAllocationCreateFlags)((ulong)in_RDX >> 0x20),
         (VkBufferUsageFlags)in_RDX,(VmaMemoryUsage)((ulong)in_RCX >> 0x20),in_stack_00000010);
  peVar1 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x15692b);
  OctreeBuilder::create_buffers::anon_class_1_0_00000001::operator()
            (in_RCX,(uint32_t *)peVar1->m_mapped_ptr);
  PVar2.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Buffer>)PVar2.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ptr<Buffer> CreateStaging(const Ptr<Device> &device, VkDeviceSize count, Writer &&writer_func,
	                                 bool sequential_write = true, const std::vector<Ptr<Queue>> &access_queues = {}) {
		Ptr<Buffer> ret = Create(device, count * sizeof(T),
		                         VMA_ALLOCATION_CREATE_MAPPED_BIT |
		                             (sequential_write ? VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT
		                                               : VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT),
		                         VK_BUFFER_USAGE_TRANSFER_SRC_BIT, VMA_MEMORY_USAGE_AUTO, access_queues);
		writer_func((T *)ret->m_mapped_ptr);
		return ret;
	}